

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::UnitTest::RecordProperty(UnitTest *this,string *key,string *value)

{
  UnitTestImpl *this_00;
  long in_FS_OFFSET;
  TestProperty TStack_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->impl_;
  TestProperty::TestProperty(&TStack_58,key,value);
  internal::UnitTestImpl::RecordProperty(this_00,&TStack_58);
  TestProperty::~TestProperty(&TStack_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnitTest::RecordProperty(const std::string& key,
                              const std::string& value) {
  impl_->RecordProperty(TestProperty(key, value));
}